

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O1

int arkInterpResize_Lagrange
              (void *arkode_mem,ARKInterp I,ARKVecResizeFn resize,void *resize_data,
              sunindextype lrw_diff,sunindextype liw_diff,N_Vector y0)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  
  if (arkode_mem == (void *)0x0) {
    iVar1 = -0x15;
  }
  else {
    iVar1 = 0;
    if (I != (ARKInterp)0x0) {
      if ((*(long *)((long)I->content + 8) != 0) &&
         (pvVar2 = I->content, 0 < *(int *)((long)pvVar2 + 4))) {
        lVar3 = 0;
        lVar4 = 0;
        do {
          iVar1 = arkResizeVec((ARKodeMem)arkode_mem,resize,resize_data,lrw_diff,liw_diff,y0,
                               (N_Vector *)(*(long *)((long)pvVar2 + 8) + lVar3));
          if (iVar1 == 0) {
            return -0x14;
          }
          lVar4 = lVar4 + 1;
          pvVar2 = I->content;
          lVar3 = lVar3 + 8;
        } while (lVar4 < *(int *)((long)pvVar2 + 4));
      }
      *(undefined4 *)((long)I->content + 0x18) = 0;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int arkInterpResize_Lagrange(void* arkode_mem, ARKInterp I,
                             ARKVecResizeFn resize, void *resize_data,
                             sunindextype lrw_diff, sunindextype liw_diff,
                             N_Vector y0)
{
  int i;
  ARKodeMem ark_mem;

  /* access ARKodeMem structure */
  if (arkode_mem == NULL)  return(ARK_MEM_NULL);
  ark_mem = (ARKodeMem) arkode_mem;

  /* resize vectors */
  if (I == NULL)  return(ARK_SUCCESS);
  if (LINT_YHIST(I) != NULL) {
    for (i=0; i<LINT_NMAXALLOC(I); i++) {
      if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                        liw_diff, y0, &(LINT_YJ(I,i))))
        return(ARK_MEM_FAIL);
    }
  }

  /* reset active history length */
  LINT_NHIST(I) = 0;

  return(ARK_SUCCESS);
}